

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value
chaiscript::dispatch::detail::Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
          (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           *t_funcs,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  Type_Conversions *this;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Type_Conversions_State *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *unaff_retaddr;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_stack_00000008;
  Type_Conversions_State state;
  Type_Conversions conv;
  Type_Conversions *in_stack_fffffffffffffee8;
  element_type *peVar3;
  Type_Conversions *in_stack_ffffffffffffff20;
  element_type *t_conversions_00;
  
  if (in_RCX == 0) {
    peVar3 = in_RDI;
    t_conversions_00 = in_RDI;
    Type_Conversions::Type_Conversions(in_stack_ffffffffffffff20);
    this = (Type_Conversions *)Type_Conversions::conversion_saves((Type_Conversions *)0x328561);
    Type_Conversions_State::Type_Conversions_State
              ((Type_Conversions_State *)peVar3,in_stack_fffffffffffffee8,(Conversion_Saves *)this);
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
              (in_stack_00000008,unaff_retaddr,(Type_Conversions_State *)t_conversions_00);
    boxed_cast<chaiscript::Boxed_Value>((Boxed_Value *)t_conversions_00,in_RSI);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x3285c2);
    Type_Conversions::~Type_Conversions(this);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    peVar3 = in_RDI;
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
              (in_stack_00000008,unaff_retaddr,(Type_Conversions_State *)in_RDI);
    boxed_cast<chaiscript::Boxed_Value>((Boxed_Value *)peVar3,in_RSI);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x32851f);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ret call(const std::vector<Const_Proxy_Function> &t_funcs, 
              const std::vector<Boxed_Value> &params, const Type_Conversions_State *t_conversions)
          {
            if (t_conversions) {
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, *t_conversions), t_conversions);
            } else {
              Type_Conversions conv;
              Type_Conversions_State state(conv, conv.conversion_saves());
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, state), t_conversions);
            }
          }